

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5InterrogatorBasicData.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::Mode5InterrogatorBasicData::Mode5InterrogatorBasicData
          (Mode5InterrogatorBasicData *this)

{
  Mode5InterrogatorBasicData *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__Mode5InterrogatorBasicData_00335f78;
  Mode5InterrogatorStatus::Mode5InterrogatorStatus(&this->m_Status);
  this->m_ui8Padding = '\0';
  this->m_ui16Padding1 = 0;
  this->m_ui32MsgFormats = 0;
  EntityIdentifier::EntityIdentifier(&this->m_InterrogatedID);
  this->m_ui16Padding2 = 0;
  return;
}

Assistant:

Mode5InterrogatorBasicData::Mode5InterrogatorBasicData() :
	m_ui8Padding( 0 ),
	m_ui16Padding1( 0 ),
	m_ui32MsgFormats( 0 ),
	m_ui16Padding2( 0 )
{	
}